

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.h
# Opt level: O2

void __thiscall
spvtools::opt::Instruction::SetOperand(Instruction *this,uint32_t index,OperandData *data)

{
  pointer pOVar1;
  uint uVar2;
  
  pOVar1 = (this->operands_).
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)(((long)(this->operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar1) / 0x30) <=
      (ulong)index) {
    __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                  ,0x2b8,
                  "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)");
  }
  uVar2 = (this->has_result_id_ & 1) + 1;
  if (this->has_type_id_ == false) {
    uVar2 = (uint)this->has_result_id_;
  }
  if (uVar2 <= index) {
    utils::SmallVector<unsigned_int,_2UL>::operator=(&pOVar1[index].words,data);
    return;
  }
  __assert_fail("index >= TypeResultIdCount() && \"operand is not a in-operand\"",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                ,0x2b9,
                "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)");
}

Assistant:

inline void Instruction::SetOperand(uint32_t index,
                                    Operand::OperandData&& data) {
  assert(index < operands_.size() && "operand index out of bound");
  assert(index >= TypeResultIdCount() && "operand is not a in-operand");
  operands_[index].words = std::move(data);
}